

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

string_view __thiscall wabt::anon_unknown_8::NameApplier::FindLabelByVar(NameApplier *this,Var *var)

{
  bool bVar1;
  __type _Var2;
  string *__rhs;
  char *pcVar3;
  size_type sVar4;
  reference pvVar5;
  int __c;
  int __c_00;
  Var *__s;
  string *label;
  int i;
  Var *var_local;
  NameApplier *this_local;
  
  __s = var;
  bVar1 = Var::is_name(var);
  if (bVar1) {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->labels_);
    label._4_4_ = (int)sVar4;
    do {
      label._4_4_ = label._4_4_ + -1;
      if (label._4_4_ < 0) {
        string_view::string_view((string_view *)&this_local);
        return _this_local;
      }
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->labels_,(long)label._4_4_);
      __rhs = Var::name_abi_cxx11_(var);
      _Var2 = std::operator==(pvVar5,__rhs);
    } while (!_Var2);
    string_view::string_view((string_view *)&this_local,pvVar5);
  }
  else {
    pcVar3 = Var::index(var,(char *)__s,__c);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->labels_);
    if (((ulong)pcVar3 & 0xffffffff) < sVar4) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->labels_);
      pcVar3 = Var::index(var,(char *)__s,__c_00);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->labels_,(sVar4 - 1) - ((ulong)pcVar3 & 0xffffffff));
      string_view::string_view((string_view *)&this_local,pvVar5);
    }
    else {
      string_view::string_view((string_view *)&this_local);
    }
  }
  return _this_local;
}

Assistant:

string_view NameApplier::FindLabelByVar(Var* var) {
  if (var->is_name()) {
    for (int i = labels_.size() - 1; i >= 0; --i) {
      const std::string& label = labels_[i];
      if (label == var->name()) {
        return label;
      }
    }
    return string_view();
  } else {
    if (var->index() >= labels_.size()) {
      return string_view();
    }
    return labels_[labels_.size() - 1 - var->index()];
  }
}